

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O2

void __thiscall wabt::AST::~AST(AST *this)

{
  if (this->f != (Func *)0x0) {
    ModuleContext::EndFunc(this->mc);
  }
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->blocks_closed).super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->block_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
  ;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
  ::~_Rb_tree(&(this->vars_defined)._M_t);
  std::vector<wabt::Node,_std::allocator<wabt::Node>_>::~vector(&this->predecls);
  std::vector<wabt::Node,_std::allocator<wabt::Node>_>::~vector(&this->exp_stack);
  return;
}

Assistant:

~AST() {
    if (f) mc.EndFunc();
  }